

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O0

void __thiscall
VSInterface::VSInDelegator::Read
          (VSInDelegator *this,char *name,vector<float,_std::allocator<float>_> *output)

{
  double dVar1;
  vector<float,_std::allocator<float>_> *this_00;
  float local_2c;
  int local_28;
  int local_24;
  int i;
  int size;
  vector<float,_std::allocator<float>_> *output_local;
  char *name_local;
  VSInDelegator *this_local;
  
  _i = output;
  output_local = (vector<float,_std::allocator<float>_> *)name;
  name_local = (char *)this;
  local_24 = (*this->_vsapi->propNumElements)(this->_in,name);
  if (-1 < local_24) {
    std::vector<float,_std::allocator<float>_>::clear(_i);
    for (local_28 = 0; this_00 = _i, local_28 < local_24; local_28 = local_28 + 1) {
      dVar1 = (*this->_vsapi->propGetFloat)(this->_in,(char *)output_local,local_28,&this->_err);
      local_2c = (float)dVar1;
      std::vector<float,_std::allocator<float>_>::push_back(this_00,&local_2c);
    }
  }
  return;
}

Assistant:

void Read(const char* name, std::vector<float>& output) override {
      auto size = _vsapi->propNumElements(_in, name);
      if (size < 0) return;
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(static_cast<float>(_vsapi->propGetFloat(_in, name, i, &_err)));
    }